

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean read_scan_integer(FILE *file,long *result,int *termchar)

{
  boolean bVar1;
  int iVar2;
  ushort **ppuVar3;
  FILE *in_RDX;
  int *in_RSI;
  FILE *in_RDI;
  bool bVar4;
  int ch;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = read_text_integer((FILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (long *)in_RDI,in_RSI);
  if (bVar1 == 0) {
    bVar1 = 0;
  }
  else {
    local_24 = in_RDX->_flags;
    while( true ) {
      bVar4 = false;
      if (local_24 != -1) {
        ppuVar3 = __ctype_b_loc();
        bVar4 = ((*ppuVar3)[local_24] & 0x2000) != 0;
      }
      if (!bVar4) break;
      local_24 = text_getc(in_RDX);
    }
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[local_24] & 0x800) == 0) {
      if (((local_24 != -1) && (local_24 != 0x3b)) && (local_24 != 0x3a)) {
        local_24 = 0x20;
      }
    }
    else {
      iVar2 = ungetc(local_24,in_RDI);
      if (iVar2 == -1) {
        return 0;
      }
      local_24 = 0x20;
    }
    in_RDX->_flags = local_24;
    bVar1 = 1;
  }
  return bVar1;
}

Assistant:

LOCAL(boolean)
read_scan_integer(FILE *file, long *result, int *termchar)
/* Variant of read_text_integer that always looks for a non-space termchar;
 * this simplifies parsing of punctuation in scan scripts.
 */
{
  register int ch;

  if (!read_text_integer(file, result, termchar))
    return FALSE;
  ch = *termchar;
  while (ch != EOF && isspace(ch))
    ch = text_getc(file);
  if (isdigit(ch)) {            /* oops, put it back */
    if (ungetc(ch, file) == EOF)
      return FALSE;
    ch = ' ';
  } else {
    /* Any separators other than ';' and ':' are ignored;
     * this allows user to insert commas, etc, if desired.
     */
    if (ch != EOF && ch != ';' && ch != ':')
      ch = ' ';
  }
  *termchar = ch;
  return TRUE;
}